

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m_png.cpp
# Opt level: O2

uint M_NextPNGChunk(PNGHandle *png,DWORD id)

{
  uint uVar1;
  Chunk *pCVar2;
  ulong uVar3;
  long lVar4;
  
  uVar1 = (png->Chunks).Count;
  uVar3 = (ulong)png->ChunkPt;
  lVar4 = uVar3 * 0xc + 4;
  while( true ) {
    if (uVar1 <= uVar3) {
      return 0;
    }
    pCVar2 = (png->Chunks).Array;
    if (*(DWORD *)((long)pCVar2 + lVar4 + -4) == id) break;
    uVar3 = uVar3 + 1;
    png->ChunkPt = (uint)uVar3;
    lVar4 = lVar4 + 0xc;
  }
  png->ChunkPt = (int)uVar3 + 1;
  (*(png->File->super_FileReaderBase)._vptr_FileReaderBase[4])
            (png->File,(ulong)*(uint *)((long)&pCVar2->ID + lVar4),0);
  return (png->Chunks).Array[png->ChunkPt - 1].Size;
}

Assistant:

unsigned int M_NextPNGChunk (PNGHandle *png, DWORD id)
{
	for ( ; png->ChunkPt < png->Chunks.Size(); ++png->ChunkPt)
	{
		if (png->Chunks[png->ChunkPt].ID == id)
		{ // Found the chunk
			png->File->Seek (png->Chunks[png->ChunkPt++].Offset, SEEK_SET);
			return png->Chunks[png->ChunkPt - 1].Size;
		}
	}
	return 0;
}